

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

Expression * __thiscall wasm::BranchUtils::BranchTargets::getTarget(BranchTargets *this,Name name)

{
  const_iterator cVar1;
  undefined1 local_20 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_20 = name.super_IString.str._M_len;
  cVar1 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Expression_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
          ::find(&(this->inner).targets._M_t,(key_type *)local_20);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->inner).targets._M_t._M_impl.super__Rb_tree_header)
  {
    return (Expression *)cVar1._M_node[1]._M_left;
  }
  __assert_fail("iter != inner.targets.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/branch-utils.h"
                ,0x1b2,"Expression *wasm::BranchUtils::BranchTargets::getTarget(Name) const");
}

Assistant:

Expression* getTarget(Name name) const {
    auto iter = inner.targets.find(name);
    assert(iter != inner.targets.end());
    return iter->second;
  }